

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextGLImpl::DrawIndexed(DeviceContextGLImpl *this,DrawIndexedAttribs *Attribs)

{
  GLenum GLIndexType;
  GLenum GlTopology;
  size_t FirstIndexByteOffset;
  GLenum local_20;
  GLenum local_1c;
  size_t local_18;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::DrawIndexed
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs,0);
  PrepareForDraw(this,Attribs->Flags,true,&local_1c);
  PrepareForIndexedDraw(this,Attribs->IndexType,Attribs->FirstIndexLocation,&local_20,&local_18);
  if ((Attribs->NumIndices != 0) && (Attribs->NumInstances != 0)) {
    DrawElements(local_1c,Attribs->NumIndices,local_20,Attribs->NumInstances,local_18,
                 Attribs->BaseVertex,Attribs->FirstInstanceLocation);
  }
  GLContextState::SetPendingMemoryBarriers
            (&this->m_ContextState,this->m_CommittedResourcesTentativeBarriers);
  this->m_CommittedResourcesTentativeBarriers = MEMORY_BARRIER_NONE;
  return;
}

Assistant:

void DeviceContextGLImpl::DrawIndexed(const DrawIndexedAttribs& Attribs)
{
    TDeviceContextBase::DrawIndexed(Attribs, 0);

    GLenum GlTopology;
    PrepareForDraw(Attribs.Flags, true, GlTopology);
    GLenum GLIndexType;
    size_t FirstIndexByteOffset;
    PrepareForIndexedDraw(Attribs.IndexType, Attribs.FirstIndexLocation, GLIndexType, FirstIndexByteOffset);

    // NOTE: Base Vertex and Base Instance versions are not supported even in OpenGL ES 3.1
    // This functionality can be emulated by adjusting stream offsets. This, however may cause
    // errors in case instance data is read from the same stream as vertex data. Thus handling
    // such cases is left to the application

    if (Attribs.NumIndices > 0 && Attribs.NumInstances > 0)
    {
        DrawElements(GlTopology,
                     Attribs.NumIndices,
                     GLIndexType,
                     Attribs.NumInstances,
                     FirstIndexByteOffset,
                     Attribs.BaseVertex,
                     Attribs.FirstInstanceLocation);
    }

    PostDraw();
}